

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  float fVar1;
  ImVec2 IVar2;
  ushort uVar3;
  ushort uVar4;
  ImWchar c;
  uint *puVar5;
  uchar *puVar6;
  uint *puVar7;
  ImFont *pIVar8;
  ImFontAtlasCustomRect *pIVar9;
  ImFontGlyph *pIVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  int i;
  long lVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  int i_1;
  uint uVar20;
  float fVar22;
  ImVec2 local_40;
  ImVec2 local_38;
  ulong uVar21;
  
  iVar17 = atlas->PackIdMouseCursors;
  pIVar9 = (atlas->CustomRects).Data;
  uVar3 = pIVar9[iVar17].X;
  if ((atlas->Flags & 2) == 0) {
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      ImFontAtlasBuildRender32bppRectFromString
                (atlas,(uint)uVar3,(uint)pIVar9[iVar17].Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'.',0xffffffff);
      ImFontAtlasBuildRender32bppRectFromString
                (atlas,uVar3 + 0x6d,(uint)pIVar9[iVar17].Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'X',0xffffffff);
    }
    else {
      ImFontAtlasBuildRender8bppRectFromString
                (atlas,(uint)uVar3,(uint)pIVar9[iVar17].Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'.',0xff);
      ImFontAtlasBuildRender8bppRectFromString
                (atlas,uVar3 + 0x6d,(uint)pIVar9[iVar17].Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'X',0xff);
    }
  }
  else {
    iVar18 = atlas->TexWidth;
    lVar16 = (ulong)pIVar9[iVar17].Y * (long)iVar18 + (ulong)uVar3;
    iVar11 = (int)lVar16;
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      puVar5 = atlas->TexPixelsRGBA32;
      puVar7 = puVar5 + (iVar18 + iVar11);
      puVar7[0] = 0xffffffff;
      puVar7[1] = 0xffffffff;
      puVar5 = puVar5 + iVar11;
      puVar5[0] = 0xffffffff;
      puVar5[1] = 0xffffffff;
    }
    else {
      lVar12 = (long)iVar11 + (long)iVar18;
      atlas->TexPixelsAlpha8[lVar12 + 1] = 0xff;
      atlas->TexPixelsAlpha8[lVar12] = 0xff;
      atlas->TexPixelsAlpha8[lVar16 + 1] = 0xff;
      atlas->TexPixelsAlpha8[lVar16] = 0xff;
    }
  }
  uVar19._0_2_ = pIVar9[iVar17].X;
  uVar19._2_2_ = pIVar9[iVar17].Y;
  IVar2 = atlas->TexUvScale;
  (atlas->TexUvWhitePixel).x = IVar2.x * ((float)(uVar19 & 0xffff) + 0.5);
  (atlas->TexUvWhitePixel).y = IVar2.y * ((float)(uVar19 >> 0x10) + 0.5);
  if ((atlas->Flags & 4) == 0) {
    pIVar9 = (atlas->CustomRects).Data + atlas->PackIdLines;
    lVar12 = 0;
    iVar17 = 0;
    lVar16 = 0;
    while (lVar16 != 0x40) {
      uVar19 = (uint)pIVar9->Width;
      puVar6 = atlas->TexPixelsAlpha8;
      iVar18 = (int)lVar16;
      if (puVar6 == (uchar *)0x0) {
        puVar7 = atlas->TexPixelsRGBA32;
        uVar3 = pIVar9->X;
        uVar4 = pIVar9->Y;
        uVar21 = (ulong)((iVar18 + (uint)uVar4) * atlas->TexWidth + (uint)uVar3);
        uVar20 = iVar17 + uVar19 >> 1;
        uVar13 = (ulong)uVar20;
        for (uVar15 = 0; uVar13 != uVar15; uVar15 = uVar15 + 1) {
          puVar7[uVar21 + uVar15] = 0;
        }
        for (lVar14 = 0; lVar16 != lVar14; lVar14 = lVar14 + 1) {
          puVar7[uVar13 + uVar21 + lVar14] = 0xffffffff;
        }
        for (uVar15 = 0; (iVar17 + uVar19) - uVar20 != uVar15; uVar15 = uVar15 + 1) {
          *(undefined4 *)((long)puVar7 + uVar15 * 4 + lVar12 + uVar13 * 4 + uVar21 * 4) = 0;
        }
      }
      else {
        uVar15 = (ulong)(((uint)pIVar9->Y + iVar18) * atlas->TexWidth + (uint)pIVar9->X);
        uVar20 = iVar17 + uVar19 >> 1;
        uVar21 = (ulong)uVar20;
        for (uVar13 = 0; uVar21 != uVar13; uVar13 = uVar13 + 1) {
          puVar6[uVar13 + uVar15] = '\0';
        }
        for (lVar14 = 0; lVar16 != lVar14; lVar14 = lVar14 + 1) {
          puVar6[lVar14 + uVar15 + uVar21] = 0xff;
        }
        for (uVar13 = 0; (iVar17 + uVar19) - uVar20 != uVar13; uVar13 = uVar13 + 1) {
          puVar6[uVar13 + uVar15 + uVar21 + lVar16] = '\0';
        }
        uVar3 = pIVar9->X;
        uVar4 = pIVar9->Y;
      }
      uVar19 = uVar19 - iVar18 >> 1;
      fVar1 = (atlas->TexUvScale).x;
      fVar22 = (atlas->TexUvScale).y;
      atlas->TexUvLines[lVar16].x = (float)((uVar3 + uVar19) - 1) * fVar1;
      fVar22 = ((float)(int)((uint)uVar4 + iVar18 + 1) * fVar22 +
               (float)(int)((uint)uVar4 + iVar18) * fVar22) * 0.5;
      atlas->TexUvLines[lVar16].y = fVar22;
      atlas->TexUvLines[lVar16].z = fVar1 * (float)(uVar3 + uVar19 + (int)(lVar16 + 1));
      atlas->TexUvLines[lVar16].w = fVar22;
      iVar17 = iVar17 + -1;
      lVar12 = lVar12 + 4;
      lVar16 = lVar16 + 1;
    }
  }
  lVar12 = 0;
  for (lVar16 = 0; lVar16 < (atlas->CustomRects).Size; lVar16 = lVar16 + 1) {
    pIVar9 = (atlas->CustomRects).Data;
    pIVar8 = *(ImFont **)((long)&pIVar9->Font + lVar12);
    if ((pIVar8 != (ImFont *)0x0) &&
       (iVar17 = *(int *)((long)&pIVar9->GlyphID + lVar12), iVar17 != 0)) {
      local_38.x = 0.0;
      local_38.y = 0.0;
      local_40.x = 0.0;
      local_40.y = 0.0;
      ImFontAtlas::CalcCustomRectUV
                (atlas,(ImFontAtlasCustomRect *)((long)&pIVar9->Width + lVar12),&local_38,&local_40)
      ;
      fVar1 = *(float *)((long)&(pIVar9->GlyphOffset).x + lVar12);
      fVar22 = *(float *)((long)&(pIVar9->GlyphOffset).y + lVar12);
      ImFont::AddGlyph(pIVar8,(ImFontConfig *)0x0,(ImWchar)iVar17,fVar1,fVar22,
                       (float)*(ushort *)((long)&pIVar9->Width + lVar12) + fVar1,
                       (float)*(ushort *)((long)&pIVar9->Height + lVar12) + fVar22,local_38.x,
                       local_38.y,local_40.x,local_40.y,
                       *(float *)((long)&pIVar9->GlyphAdvanceX + lVar12));
    }
    lVar12 = lVar12 + 0x20;
  }
  for (lVar16 = 0; uVar19 = (atlas->Fonts).Size, lVar16 < (int)uVar19; lVar16 = lVar16 + 1) {
    pIVar8 = (atlas->Fonts).Data[lVar16];
    if (pIVar8->DirtyLookupTables == true) {
      ImFont::BuildLookupTable(pIVar8);
    }
  }
  uVar15 = 0;
  uVar13 = (ulong)uVar19;
  if ((int)uVar19 < 1) {
    uVar13 = uVar15;
  }
  do {
    if (uVar15 == uVar13) {
      return;
    }
    pIVar8 = (atlas->Fonts).Data[uVar15];
    if (pIVar8->EllipsisChar == 0xffff) {
      lVar16 = 0;
      do {
        if (lVar16 == 4) goto LAB_0012db02;
        c = *(ImWchar *)((long)&DAT_001584b8 + lVar16);
        pIVar10 = ImFont::FindGlyphNoFallback(pIVar8,c);
        lVar16 = lVar16 + 2;
      } while (pIVar10 == (ImFontGlyph *)0x0);
      pIVar8->EllipsisChar = c;
    }
LAB_0012db02:
    uVar15 = uVar15 + 1;
  } while( true );
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data blocks
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL || atlas->TexPixelsRGBA32 != NULL);
    ImFontAtlasBuildRenderDefaultTexData(atlas);
    ImFontAtlasBuildRenderLinesTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect* r = &atlas->CustomRects[i];
        if (r->Font == NULL || r->GlyphID == 0)
            continue;

        // Will ignore ImFontConfig settings: GlyphMinAdvanceX, GlyphMinAdvanceY, GlyphExtraSpacing, PixelSnapH
        IM_ASSERT(r->Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(r, &uv0, &uv1);
        r->Font->AddGlyph(NULL, (ImWchar)r->GlyphID, r->GlyphOffset.x, r->GlyphOffset.y, r->GlyphOffset.x + r->Width, r->GlyphOffset.y + r->Height, uv0.x, uv0.y, uv1.x, uv1.y, r->GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();

    // Ellipsis character is required for rendering elided text. We prefer using U+2026 (horizontal ellipsis).
    // However some old fonts may contain ellipsis at U+0085. Here we auto-detect most suitable ellipsis character.
    // FIXME: Also note that 0x2026 is currently seldom included in our font ranges. Because of this we are more likely to use three individual dots.
    for (int i = 0; i < atlas->Fonts.size(); i++)
    {
        ImFont* font = atlas->Fonts[i];
        if (font->EllipsisChar != (ImWchar)-1)
            continue;
        const ImWchar ellipsis_variants[] = { (ImWchar)0x2026, (ImWchar)0x0085 };
        for (int j = 0; j < IM_ARRAYSIZE(ellipsis_variants); j++)
            if (font->FindGlyphNoFallback(ellipsis_variants[j]) != NULL) // Verify glyph exists
            {
                font->EllipsisChar = ellipsis_variants[j];
                break;
            }
    }
}